

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

vector<double,_std::allocator<double>_> *
add_matrix<double>(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                  vector<double,_std::allocator<double>_> *a,
                  vector<double,_std::allocator<double>_> *b)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  uint uVar5;
  allocator_type local_29;
  
  uVar5 = (uint)((ulong)((long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)(int)uVar5,&local_29);
  if (0 < (int)uVar5) {
    pdVar1 = (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      pdVar3[uVar4] = pdVar1[uVar4] + pdVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> add_matrix(const std::vector<T>& a, const std::vector<T>& b){
    int n = a.size();
    std::vector<T> ans(n);
    for (int i = 0; i < n; ++i)
        ans[i] = a[i] + b[i];
    return ans;
}